

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

bool __thiscall Comparator::operator()(Comparator *this,ScheduleHandle *s1,ScheduleHandle *s2)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  pVar6 = Schedule::analyze((s1->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pVar7 = Schedule::analyze((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar1 = this->limit;
  bVar3 = pVar7.first <= uVar1;
  if (pVar6.first <= uVar1 == bVar3) {
    if (uVar1 < pVar6.first) {
      dVar4 = score(this,s1);
      dVar5 = score(this,s2);
      bVar3 = dVar4 == dVar5;
      bVar2 = dVar4 < dVar5;
    }
    else {
      bVar2 = pVar6.second < pVar7.second;
      bVar3 = pVar6.second == pVar7.second;
    }
    bVar3 = !bVar2 && !bVar3;
  }
  return bVar3;
}

Assistant:

bool operator () (const ScheduleHandle &s1, const ScheduleHandle &s2) const {
        // Whether reaching limit
        size_t s1_peak_memory, s2_peak_memory;
        uint64_t s1_total_time, s2_total_time;
        std::tie(s1_peak_memory, s1_total_time) = s1->analyze();
        std::tie(s2_peak_memory, s2_total_time) = s2->analyze();
        if ((s1_peak_memory <= limit) != (s2_peak_memory <= limit)) {
            return s2_peak_memory <= limit;
        } else if (s1_peak_memory <= limit) {
            return s1_total_time > s2_total_time;
        }

        // Compare both time and memory
        return score(s1) > score(s2);
    }